

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRHS.cpp
# Opt level: O3

void __thiscall HEkkDualRHS::updatePivots(HEkkDualRHS *this,HighsInt iRow,double value)

{
  double dVar1;
  double dVar2;
  HEkk *pHVar3;
  double dVar4;
  
  pHVar3 = this->ekk_instance_;
  dVar1 = (pHVar3->options_->super_HighsOptionsStruct).primal_feasibility_tolerance;
  (pHVar3->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iRow] = value;
  dVar4 = (pHVar3->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[iRow];
  if (dVar4 - dVar1 <= value) {
    dVar2 = (pHVar3->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iRow];
    dVar4 = 0.0;
    if (dVar1 + dVar2 < value) {
      dVar4 = value - dVar2;
    }
  }
  else {
    dVar4 = dVar4 - value;
  }
  if ((pHVar3->info_).store_squared_primal_infeasibility == false) {
    dVar4 = ABS(dVar4);
  }
  else {
    dVar4 = dVar4 * dVar4;
  }
  (this->work_infeasibility).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iRow] = dVar4;
  return;
}

Assistant:

void HEkkDualRHS::updatePivots(const HighsInt iRow, const double value) {
  // Update the primal value for the row (iRow) where the basis change
  // has occurred, and set the corresponding primal infeasibility
  // value in work_infeasibility
  //
  const double Tp = ekk_instance_.options_->primal_feasibility_tolerance;
  ekk_instance_.info_.baseValue_[iRow] = value;
  // @primal_infeasibility calculation
  const double lower = ekk_instance_.info_.baseLower_[iRow];
  const double upper = ekk_instance_.info_.baseUpper_[iRow];
  double primal_infeasibility = 0;
  if (value < lower - Tp) {
    primal_infeasibility = lower - value;
  } else if (value > upper + Tp) {
    primal_infeasibility = value - upper;
  }
  if (ekk_instance_.info_.store_squared_primal_infeasibility)
    work_infeasibility[iRow] = primal_infeasibility * primal_infeasibility;
  else
    work_infeasibility[iRow] = fabs(primal_infeasibility);
}